

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsm-builder.cc
# Opt level: O3

Cluster * __thiscall
cnn::HierarchicalSoftmaxBuilder::ReadClusterFile
          (HierarchicalSoftmaxBuilder *this,string *cluster_file,Dict *word_dict)

{
  long lVar1;
  pointer puVar2;
  char cVar3;
  uint uVar4;
  ostream *poVar5;
  Cluster *this_00;
  istream *piVar6;
  Cluster *pCVar7;
  pointer ppCVar8;
  uint uVar9;
  ulong uVar10;
  uint *puVar11;
  ulong uVar12;
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  string line;
  string word;
  ifstream in;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2c8;
  uint local_2a4;
  vector<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_> *local_2a0;
  HierarchicalSoftmaxBuilder *local_298;
  ulong local_290;
  undefined1 *local_288;
  ulong local_280;
  undefined1 local_278 [16];
  Dict *local_268;
  Dict *local_260;
  string local_258;
  long local_238 [65];
  
  local_298 = this;
  local_268 = word_dict;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Reading clusters from ",0x16);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(cluster_file->_M_dataplus)._M_p,
                      cluster_file->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," ...\n",5);
  std::ifstream::ifstream(local_238,(string *)cluster_file,_S_in);
  local_288 = local_278;
  local_280 = 0;
  local_278[0] = 0;
  local_2c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_2c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint *)0x0;
  local_2c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  this_00 = (Cluster *)operator_new(0xb8);
  Cluster::Cluster(this_00);
  local_260 = &local_298->path_symbols;
  local_2a0 = &local_298->widx2path;
  do {
    cVar3 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_288,cVar3);
    if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Done reading clusters.\n",0x17);
      if (local_2c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (uint *)0x0) {
        operator_delete(local_2c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_288 != local_278) {
        operator_delete(local_288);
      }
      std::ifstream::~ifstream(local_238);
      return this_00;
    }
    if (local_2c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_2c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_2c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_2c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    uVar4 = (uint)local_280;
    uVar12 = local_280 & 0xffffffff;
    pCVar7 = this_00;
    if (uVar4 == 0) {
      uVar9 = 0;
    }
    else {
      uVar9 = 0;
      do {
        uVar10 = (ulong)uVar9 - 1;
        do {
          lVar1 = uVar10 + 1;
          uVar10 = uVar10 + 1;
          if (uVar12 <= uVar10) break;
        } while (local_288[lVar1] == ' ' || local_288[lVar1] == '\t');
        if ((uint)uVar10 < uVar4) {
          do {
            if ((local_288[uVar10] == '\t') || (local_288[uVar10] == ' ')) break;
            uVar10 = uVar10 + 1;
          } while (uVar10 < uVar12);
        }
        else {
          uVar10 = uVar10 & 0xffffffff;
        }
        std::__cxx11::string::substr((ulong)&local_258,(ulong)&local_288);
        local_2a4 = Dict::Convert(local_260,&local_258);
        if (local_2c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_2c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_2c8,
                     (iterator)
                     local_2c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_2a4);
        }
        else {
          *local_2c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = local_2a4;
          local_2c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_2c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        cVar3 = local_288[uVar10];
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p);
        }
        puVar2 = local_2c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      } while ((cVar3 == ' ') && (uVar9 = (int)uVar10 + 1, uVar9 < uVar4));
      local_290 = uVar10 & 0xffffffff;
      for (puVar11 = local_2c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start; puVar11 != puVar2;
          puVar11 = puVar11 + 1) {
        pCVar7 = Cluster::add_child(pCVar7,*puVar11);
      }
      uVar9 = (uint)local_290;
    }
    uVar10 = (ulong)uVar9 - 1;
    do {
      lVar1 = uVar10 + 1;
      uVar10 = uVar10 + 1;
      if (uVar12 <= uVar10) break;
    } while (local_288[lVar1] == ' ' || local_288[lVar1] == '\t');
    if ((uint)uVar10 < uVar4) {
      do {
        if ((local_288[uVar10] == '\t') || (local_288[uVar10] == ' ')) break;
        uVar10 = uVar10 + 1;
      } while (uVar10 < uVar12);
    }
    std::__cxx11::string::substr((ulong)&local_258,(ulong)&local_288);
    uVar4 = Dict::Convert(local_268,&local_258);
    Cluster::add_word(pCVar7,uVar4);
    ppCVar8 = (local_298->widx2path).
              super__Vector_base<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(local_298->widx2path).
                      super__Vector_base<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppCVar8 >> 3) <= (ulong)uVar4) {
      std::vector<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>::resize
                (local_2a0,(ulong)(uVar4 + 1));
      ppCVar8 = (local_2a0->super__Vector_base<cnn::Cluster_*,_std::allocator<cnn::Cluster_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
    }
    ppCVar8[uVar4] = pCVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p);
    }
  } while( true );
}

Assistant:

Cluster* HierarchicalSoftmaxBuilder::ReadClusterFile(const std::string& cluster_file, Dict* word_dict) {
  cerr << "Reading clusters from " << cluster_file << " ...\n";
  ifstream in(cluster_file);
  assert(in);
  int wc = 0;
  string line;
  vector<unsigned> path;
  Cluster* root = new Cluster();
  while(getline(in, line)) {
    path.clear();
    ++wc;
    const unsigned len = line.size();
    unsigned startp = 0;
    unsigned endp = 0;
    while (startp < len) {
      while (is_ws(line[startp]) && startp < len) { ++startp; }
      endp = startp;
      while (not_ws(line[endp]) && endp < len) { ++endp; }
      string symbol = line.substr(startp, endp - startp);
      path.push_back(path_symbols.Convert(symbol));
      if (line[endp] == ' ') {
        startp = endp + 1;
        continue;
      }
      else {
        break;
      }
    }
    Cluster* node = root;
    for (unsigned symbol : path) {
      node = node->add_child(symbol);
    }

    unsigned startw = endp;
    while (is_ws(line[startw]) && startw < len) { ++startw; }
    unsigned endw = startw;
    while (not_ws(line[endw]) && endw < len) { ++endw; }
    assert(endp > startp);
    assert(startw > endp);
    assert(endw > startw);

    string word = line.substr(startw, endw - startw);
    unsigned widx = word_dict->Convert(word);
    node->add_word(widx);

    if (widx2path.size() <= widx) {
      widx2path.resize(widx + 1);
    }
    widx2path[widx] = node;
  }
  cerr << "Done reading clusters.\n";
  return root;
}